

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O0

AssertionResult __thiscall
anon_unknown.dwarf_f3ff::IsEqual(anon_unknown_dwarf_f3ff *this,void *vec_a,void *vec_b,size_t size)

{
  int iVar1;
  AssertionResult *pAVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  AssertionResult local_1e8;
  undefined4 local_1d8;
  size_t local_1c8;
  size_t len;
  size_t errors;
  size_t i;
  uint8_t *b;
  uint8_t *a;
  ostringstream out;
  size_t size_local;
  void *vec_b_local;
  void *vec_a_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&a);
  len = 0;
  i = (size_t)vec_b;
  b = (uint8_t *)vec_a;
  for (errors = 0; errors < size; errors = errors + 4) {
    local_1c8 = 4;
    if (size < errors + 4) {
      local_1c8 = size - errors;
    }
    std::operator<<((ostream *)&a,"  ");
    PrintWord(b + errors,local_1c8,(ostream *)&a);
    iVar1 = memcmp(b + errors,(void *)(i + errors),local_1c8);
    if (iVar1 == 0) {
      std::operator<<((ostream *)&a,"   ");
    }
    else {
      std::operator<<((ostream *)&a," ! ");
      len = len + 1;
    }
    PrintWord((uint8_t *)(i + errors),local_1c8,(ostream *)&a);
    std::operator<<((ostream *)&a,"\n");
  }
  if (len == 0) {
    testing::AssertionSuccess();
  }
  else {
    testing::AssertionFailure();
    pAVar2 = testing::AssertionResult::operator<<
                       (&local_1e8,(char (*) [23])"A and B aren\'t equal:\n");
    std::__cxx11::ostringstream::str();
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_208);
    testing::AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
    std::__cxx11::string::~string((string *)&local_208);
    testing::AssertionResult::~AssertionResult(&local_1e8);
  }
  local_1d8 = 1;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&a);
  AVar3.message_.ptr_ = extraout_RDX.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

::testing::AssertionResult IsEqual(const void *vec_a, const void *vec_b,
                                   size_t size) {
  std::ostringstream out;
  const uint8_t *a = reinterpret_cast<const uint8_t*>(vec_a);
  const uint8_t *b = reinterpret_cast<const uint8_t*>(vec_b);
  size_t i, errors = 0;
  for (i = 0; i < size; i += 4) {
    size_t len = 4;
    if (i + len > size)
      len = size - i;
    out << "  ";
    PrintWord(a+i, len, out);
    if (memcmp(a+i, b+i, len) == 0) {
      out << "   ";
    } else {
      out << " ! ";
      ++errors;
    }
    PrintWord(b+i, len, out);
    out << "\n";
  }
  if (!errors)
    return ::testing::AssertionSuccess();
  else
    return ::testing::AssertionFailure()
        << "A and B aren't equal:\n"
        << out.str();
}